

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls.c
# Opt level: O1

int alloc_file(lws_context *context,char *filename,uint8_t **buf,lws_filepos_t *amount)

{
  int iVar1;
  FILE *__stream;
  size_t size;
  uint8_t *__ptr;
  size_t sVar2;
  int iVar3;
  
  __stream = fopen(filename,"rb");
  iVar3 = 1;
  if (__stream != (FILE *)0x0) {
    iVar1 = fseek(__stream,0,2);
    if (iVar1 == 0) {
      size = ftell(__stream);
      if (size != 0xffffffffffffffff) {
        iVar1 = fseek(__stream,0,0);
        if (iVar1 == 0) {
          __ptr = (uint8_t *)lws_realloc((void *)0x0,size,"alloc_file");
          *buf = __ptr;
          if (__ptr == (uint8_t *)0x0) {
            iVar3 = 2;
          }
          else {
            sVar2 = fread(__ptr,size,1,__stream);
            if (sVar2 == 1) {
              *amount = size;
              iVar3 = 0;
            }
            else {
              lws_realloc(*buf,0,"lws_free");
            }
          }
        }
      }
    }
  }
  if (__stream != (FILE *)0x0) {
    fclose(__stream);
  }
  return iVar3;
}

Assistant:

int alloc_file(struct lws_context *context, const char *filename, uint8_t **buf,
		lws_filepos_t *amount)
{
	FILE *f;
	size_t s;
	int n = 0;

	f = fopen(filename, "rb");
	if (f == NULL) {
		n = 1;
		goto bail;
	}

	if (fseek(f, 0, SEEK_END) != 0) {
		n = 1;
		goto bail;
	}

	s = ftell(f);
	if (s == (size_t)-1) {
		n = 1;
		goto bail;
	}

	if (fseek(f, 0, SEEK_SET) != 0) {
		n = 1;
		goto bail;
	}

	*buf = lws_malloc(s, "alloc_file");
	if (!*buf) {
		n = 2;
		goto bail;
	}

	if (fread(*buf, s, 1, f) != 1) {
		lws_free(*buf);
		n = 1;
		goto bail;
	}

	*amount = s;

bail:
	if (f)
		fclose(f);

	return n;

}